

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O3

reference __thiscall
QVLABase<QOpenGLFramebufferObjectPrivate::ColorAttachment>::
emplace_back_impl<QOpenGLFramebufferObjectPrivate::ColorAttachment>
          (QVLABase<QOpenGLFramebufferObjectPrivate::ColorAttachment> *this,qsizetype prealloc,
          void *array,ColorAttachment *args)

{
  qsizetype *pqVar1;
  reference pvVar2;
  GLenum GVar3;
  undefined4 uVar4;
  long asize;
  long aalloc;
  
  asize = (this->super_QVLABaseBase).s;
  if (asize == (this->super_QVLABaseBase).a) {
    aalloc = asize + 1;
    if (asize + 1 < asize * 2) {
      aalloc = asize * 2;
    }
    reallocate_impl(this,prealloc,array,asize,aalloc);
    asize = (this->super_QVLABaseBase).s;
  }
  pvVar2 = (reference)((long)(this->super_QVLABaseBase).ptr + asize * 0x18);
  pvVar2->guard = args->guard;
  GVar3 = args->internalFormat;
  uVar4 = *(undefined4 *)&args->field_0xc;
  pvVar2->size = args->size;
  pvVar2->internalFormat = GVar3;
  *(undefined4 *)&pvVar2->field_0xc = uVar4;
  pqVar1 = &(this->super_QVLABaseBase).s;
  *pqVar1 = *pqVar1 + 1;
  return pvVar2;
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }